

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void codebinexpval(FuncState *fs,OpCode op,expdesc *e1,expdesc *e2,int line)

{
  int c;
  int b;
  uint uVar1;
  int iVar2;
  OpCode OVar3;
  
  c = luaK_exp2RK(fs,e2);
  b = luaK_exp2RK(fs,e1);
  freeexps(fs,e1,e2);
  iVar2 = c;
  switch(op) {
  case OP_ADD:
    if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 8) {
        OVar3 = OP_RAVI_ADDII;
LAB_00127496:
        iVar2 = luaK_codeABC(fs,OVar3,0,b,c);
        (e1->u).info = iVar2;
        e1->ravi_type_map = 8;
        goto LAB_001274b3;
      }
      if (e2->ravi_type_map == 0x10) {
        OVar3 = OP_RAVI_ADDFI;
        goto LAB_00127450;
      }
    }
    else if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 8) {
        OVar3 = OP_RAVI_ADDFI;
      }
      else {
        if (e2->ravi_type_map != 0x10) goto LAB_00127383;
        OVar3 = OP_RAVI_ADDFF;
      }
LAB_00127475:
      iVar2 = luaK_codeABC(fs,OVar3,0,b,c);
      (e1->u).info = iVar2;
      goto LAB_001274b3;
    }
LAB_00127383:
    OVar3 = OP_ADD;
    goto LAB_001273e1;
  case OP_SUB:
    if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 8) {
        OVar3 = OP_RAVI_SUBII;
        goto LAB_00127496;
      }
      if (e2->ravi_type_map == 0x10) {
        OVar3 = OP_RAVI_SUBIF;
        iVar2 = b;
        b = c;
        goto LAB_00127450;
      }
    }
    else if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 8) {
        OVar3 = OP_RAVI_SUBFI;
      }
      else {
        if (e2->ravi_type_map != 0x10) goto LAB_001273c5;
        OVar3 = OP_RAVI_SUBFF;
      }
      goto LAB_00127475;
    }
LAB_001273c5:
    OVar3 = OP_SUB;
    goto LAB_001273e1;
  case OP_MUL:
    if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 8) {
        OVar3 = OP_RAVI_MULII;
        goto LAB_00127496;
      }
      if (e2->ravi_type_map == 0x10) {
        OVar3 = OP_RAVI_MULFI;
        goto LAB_00127450;
      }
    }
    else if (e1->ravi_type_map == 0x10) {
      if (e2->ravi_type_map == 8) {
        OVar3 = OP_RAVI_MULFI;
      }
      else {
        if (e2->ravi_type_map != 0x10) goto LAB_001273ab;
        OVar3 = OP_RAVI_MULFF;
      }
      goto LAB_00127475;
    }
LAB_001273ab:
    OVar3 = OP_MUL;
    goto LAB_001273e1;
  case OP_MOD:
    if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 8) {
        OVar3 = OP_MOD;
        goto LAB_00127496;
      }
      if (e2->ravi_type_map == 0x10) {
        OVar3 = OP_MOD;
        iVar2 = b;
        b = c;
        goto LAB_00127450;
      }
    }
    else if ((e1->ravi_type_map == 0x10) &&
            ((e2->ravi_type_map == 8 || (e2->ravi_type_map == 0x10)))) {
      OVar3 = OP_MOD;
      goto LAB_00127475;
    }
    OVar3 = OP_MOD;
    goto LAB_001273e1;
  case OP_POW:
    if (e1->ravi_type_map == 8) {
      if ((e2->ravi_type_map == 8) || (e2->ravi_type_map == 0x10)) {
        OVar3 = OP_POW;
        iVar2 = b;
        b = c;
        goto LAB_00127450;
      }
    }
    else if ((e1->ravi_type_map == 0x10) &&
            ((e2->ravi_type_map == 8 || (e2->ravi_type_map == 0x10)))) {
      OVar3 = OP_POW;
      goto LAB_00127475;
    }
    OVar3 = OP_POW;
LAB_0012731a:
    iVar2 = luaK_codeABC(fs,OVar3,0,b,c);
    (e1->u).info = iVar2;
    if (((e1->ravi_type_map & 0xffffffe7) != 0) || ((e2->ravi_type_map & 0xffffffe7) != 0))
    goto LAB_0012740d;
    goto LAB_00127459;
  case OP_DIV:
    if (e1->ravi_type_map != 8) {
      if (e1->ravi_type_map == 0x10) {
        if (e2->ravi_type_map == 8) {
          OVar3 = OP_RAVI_DIVFI;
        }
        else {
          if (e2->ravi_type_map != 0x10) goto LAB_00127318;
          OVar3 = OP_RAVI_DIVFF;
        }
        goto LAB_00127475;
      }
LAB_00127318:
      OVar3 = OP_DIV;
      goto LAB_0012731a;
    }
    if (e2->ravi_type_map == 8) {
      OVar3 = OP_RAVI_DIVII;
      iVar2 = b;
      b = c;
    }
    else {
      if (e2->ravi_type_map != 0x10) goto LAB_00127318;
      OVar3 = OP_RAVI_DIVIF;
      iVar2 = b;
      b = c;
    }
LAB_00127450:
    iVar2 = luaK_codeABC(fs,OVar3,0,iVar2,b);
    (e1->u).info = iVar2;
    goto LAB_00127459;
  case OP_IDIV:
    if (e1->ravi_type_map == 8) {
      if (e2->ravi_type_map == 8) {
        OVar3 = OP_IDIV;
        goto LAB_00127496;
      }
      if (e2->ravi_type_map == 0x10) {
        OVar3 = OP_IDIV;
        iVar2 = b;
        b = c;
        goto LAB_00127450;
      }
    }
    else if ((e1->ravi_type_map == 0x10) &&
            ((e2->ravi_type_map == 8 || (e2->ravi_type_map == 0x10)))) {
      OVar3 = OP_IDIV;
      goto LAB_00127475;
    }
    OVar3 = OP_IDIV;
LAB_001273e1:
    iVar2 = luaK_codeABC(fs,OVar3,0,b,c);
    (e1->u).info = iVar2;
    if (((e1->ravi_type_map & 0xffffffe7) == 0) && ((e2->ravi_type_map & 0xffffffe7) == 0)) {
      if ((e1->ravi_type_map & e2->ravi_type_map & 8) == 0) {
LAB_00127459:
        e1->ravi_type_map = 0x10;
      }
      else {
        e1->ravi_type_map = 0x18;
      }
      goto LAB_001274b3;
    }
    goto LAB_0012740d;
  case OP_BAND:
    if (e1->ravi_type_map == 8) {
      uVar1 = e2->ravi_type_map;
      if (uVar1 == 8) {
        OVar3 = OP_RAVI_BAND_II;
        goto LAB_00127475;
      }
LAB_0012728b:
      if ((uVar1 & 0xffffffe7) == 0) {
        OVar3 = OP_BAND;
        goto LAB_00127496;
      }
    }
    else if ((e1->ravi_type_map & 0xffffffe7) == 0) {
      uVar1 = e2->ravi_type_map;
      goto LAB_0012728b;
    }
    op = OP_BAND;
    break;
  case OP_BOR:
    if (e1->ravi_type_map == 8) {
      uVar1 = e2->ravi_type_map;
      if (uVar1 == 8) {
        OVar3 = OP_RAVI_BOR_II;
        goto LAB_00127475;
      }
LAB_001272bf:
      if ((uVar1 & 0xffffffe7) == 0) {
        OVar3 = OP_BOR;
        goto LAB_00127496;
      }
    }
    else if ((e1->ravi_type_map & 0xffffffe7) == 0) {
      uVar1 = e2->ravi_type_map;
      goto LAB_001272bf;
    }
    op = OP_BOR;
    break;
  case OP_BXOR:
    if (e1->ravi_type_map == 8) {
      uVar1 = e2->ravi_type_map;
      if (uVar1 == 8) {
        OVar3 = OP_RAVI_BXOR_II;
        goto LAB_00127475;
      }
LAB_001272a5:
      if ((uVar1 & 0xffffffe7) == 0) {
        OVar3 = OP_BXOR;
        goto LAB_00127496;
      }
    }
    else if ((e1->ravi_type_map & 0xffffffe7) == 0) {
      uVar1 = e2->ravi_type_map;
      goto LAB_001272a5;
    }
    op = OP_BXOR;
    break;
  case OP_SHL:
    if (e1->ravi_type_map == 8) {
      uVar1 = e2->ravi_type_map;
      if (uVar1 == 8) {
        OVar3 = OP_RAVI_SHL_II;
        goto LAB_00127475;
      }
LAB_00127257:
      if ((uVar1 & 0xffffffe7) == 0) {
        OVar3 = OP_SHL;
        goto LAB_00127496;
      }
    }
    else if ((e1->ravi_type_map & 0xffffffe7) == 0) {
      uVar1 = e2->ravi_type_map;
      goto LAB_00127257;
    }
    op = OP_SHL;
    break;
  case OP_SHR:
    if (e1->ravi_type_map == 8) {
      uVar1 = e2->ravi_type_map;
      if (uVar1 == 8) {
        OVar3 = OP_RAVI_SHR_II;
        goto LAB_00127475;
      }
LAB_00127271:
      if ((uVar1 & 0xffffffe7) == 0) {
        OVar3 = OP_SHR;
        goto LAB_00127496;
      }
    }
    else if ((e1->ravi_type_map & 0xffffffe7) == 0) {
      uVar1 = e2->ravi_type_map;
      goto LAB_00127271;
    }
    op = OP_SHR;
    break;
  default:
    break;
  case OP_CONCAT:
    iVar2 = luaK_codeABC(fs,OP_CONCAT,0,b,c);
    (e1->u).info = iVar2;
    if (((e1->ravi_type_map & 0xfffffee7) == 0) && ((e2->ravi_type_map & 0xfffffee7) == 0)) {
      e1->ravi_type_map = 0x100;
      goto LAB_001274b3;
    }
    goto LAB_0012740d;
  }
  iVar2 = luaK_codeABC(fs,op,0,b,c);
  (e1->u).info = iVar2;
LAB_0012740d:
  e1->ravi_type_map = 0xffffffff;
LAB_001274b3:
  e1->k = VRELOCABLE;
  fs->f->lineinfo[(long)fs->pc + -1] = line;
  return;
}

Assistant:

static void codebinexpval (FuncState *fs, OpCode op,
                           expdesc *e1, expdesc *e2, int line) {
  /* Note that the order below is important - see Lua 5.3.3 bug list*/
  int rk2 = luaK_exp2RK(fs, e2);  /* both operands are "RK" */
  int rk1 = luaK_exp2RK(fs, e1);
  freeexps(fs, e1, e2);

#define RAVI_OPCODE_SPECIALIZED(op, t) OP_RAVI_##op##t
#define RAVI_OPCODE_GENERIC(op, t) OP_##op
#define RAVI_COMMUTATIVE(op, t) luaK_codeABC(fs, t(op, FI), 0, rk2, rk1)
#define RAVI_NON_COMMUTATIVE(op, t) luaK_codeABC(fs, t(op, IF), 0, rk1, rk2)
#define RAVI_GEN_ARITH(op, co, ii, t)                                      \
  case OP_##op:                                                            \
    if (e1->ravi_type_map == RAVI_TM_FLOAT) {                              \
      if (e2->ravi_type_map == RAVI_TM_FLOAT) {                            \
        e1->u.info = luaK_codeABC(fs, t(op, FF), 0, rk1, rk2);             \
        break;                                                             \
      }                                                                    \
      else if (e2->ravi_type_map == RAVI_TM_INTEGER) {                     \
        e1->u.info = luaK_codeABC(fs, t(op, FI), 0, rk1, rk2);             \
        break;                                                             \
      }                                                                    \
    }                                                                      \
    else if (e1->ravi_type_map == RAVI_TM_INTEGER) {                       \
      if (e2->ravi_type_map == RAVI_TM_FLOAT) {                            \
        e1->u.info = co(op, t);                                            \
        e1->ravi_type_map = RAVI_TM_FLOAT;                                 \
        break;                                                             \
      }                                                                    \
      else if (e2->ravi_type_map == RAVI_TM_INTEGER) {                     \
        e1->u.info = luaK_codeABC(fs, t(op, II), 0, rk1, rk2);             \
        e1->ravi_type_map = ii;                                            \
        break;                                                             \
      }                                                                    \
    }                                                                      \
    e1->u.info = luaK_codeABC(fs, OP_##op, 0, rk1, rk2);                   \
    if ((e1->ravi_type_map & (~(RAVI_TM_FLOAT | RAVI_TM_INTEGER))) == 0 && \
        (e2->ravi_type_map & (~(RAVI_TM_FLOAT | RAVI_TM_INTEGER))) == 0) { \
      if (e1->ravi_type_map & e2->ravi_type_map & RAVI_TM_INTEGER) {       \
        e1->ravi_type_map = RAVI_TM_FLOAT | ii;                            \
      }                                                                    \
      else {                                                               \
        e1->ravi_type_map = RAVI_TM_FLOAT;                                 \
      }                                                                    \
    }                                                                      \
    else {                                                                 \
      e1->ravi_type_map = RAVI_TM_ANY;                                     \
    }                                                                      \
    break

#define RAVI_GEN_INT_OP(op)                                                                                  \
  case OP_##op:                                                                                              \
    if (e1->ravi_type_map == RAVI_TM_INTEGER && e2->ravi_type_map == RAVI_TM_INTEGER) {                      \
      e1->u.info = luaK_codeABC(fs, OP_RAVI_##op##_II, 0, rk1, rk2);                                         \
    }                                                                                                        \
    else if ((e1->ravi_type_map & (~RAVI_TM_NUMBER)) == 0 && (e2->ravi_type_map & (~RAVI_TM_NUMBER)) == 0) { \
      e1->u.info = luaK_codeABC(fs, OP_##op, 0, rk1, rk2);                                                   \
      e1->ravi_type_map = RAVI_TM_INTEGER;                                                                   \
    }                                                                                                        \
    else {                                                                                                   \
      e1->u.info = luaK_codeABC(fs, OP_##op, 0, rk1, rk2);                                                   \
      e1->ravi_type_map = RAVI_TM_ANY;                                                                       \
    }                                                                                                        \
    break

  switch (op) {
    RAVI_GEN_ARITH(ADD, RAVI_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_SPECIALIZED);
    RAVI_GEN_ARITH(SUB, RAVI_NON_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_SPECIALIZED);
    RAVI_GEN_ARITH(MUL, RAVI_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_SPECIALIZED);
    RAVI_GEN_ARITH(DIV, RAVI_NON_COMMUTATIVE, RAVI_TM_FLOAT, RAVI_OPCODE_SPECIALIZED);
    RAVI_GEN_ARITH(IDIV, RAVI_NON_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_GENERIC);
    RAVI_GEN_ARITH(MOD, RAVI_NON_COMMUTATIVE, RAVI_TM_INTEGER, RAVI_OPCODE_GENERIC);
    RAVI_GEN_ARITH(POW, RAVI_NON_COMMUTATIVE, RAVI_TM_FLOAT, RAVI_OPCODE_GENERIC);
    RAVI_GEN_INT_OP(BAND);
    RAVI_GEN_INT_OP(BOR);
    RAVI_GEN_INT_OP(BXOR);
    RAVI_GEN_INT_OP(SHL);
    RAVI_GEN_INT_OP(SHR);
    case OP_CONCAT:
      e1->u.info = luaK_codeABC(fs, op, 0, rk1, rk2);
      if ((e1->ravi_type_map & (~(RAVI_TM_STRING | RAVI_TM_INTEGER | RAVI_TM_FLOAT))) == 0 &&
          (e2->ravi_type_map & (~(RAVI_TM_STRING | RAVI_TM_INTEGER | RAVI_TM_FLOAT))) == 0) {
        e1->ravi_type_map = RAVI_TM_STRING;
      }
      else {
        e1->ravi_type_map = RAVI_TM_ANY;
      }
      break;
    default:
      e1->u.info = luaK_codeABC(fs, op, 0, rk1, rk2);
      e1->ravi_type_map = RAVI_TM_ANY;
  }

  e1->k = VRELOCABLE;  /* all those operations are relocatable */
  luaK_fixline(fs, line);
}